

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

shared_ptr<Map_Item> __thiscall
Map::AddItem(Map *this,short id,int amount,uchar x,uchar y,Character *from)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Character *this_01;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  mapped_type *pmVar6;
  _Node *p_Var7;
  int num;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _List_node_base *p_Var9;
  undefined6 in_register_00000032;
  Map *this_02;
  World *pWVar10;
  int iVar11;
  int iVar12;
  shared_ptr<Map_Item> sVar13;
  Character *in_stack_00000008;
  PacketBuilder builder;
  undefined1 local_80 [48];
  key_type local_50;
  
  this_02 = (Map *)CONCAT62(in_register_00000032,id);
  num = (int)CONCAT71(in_register_00000009,x);
  puVar5 = (undefined8 *)operator_new(0x28);
  puVar5[1] = 0x100000001;
  *puVar5 = &PTR___Sp_counted_ptr_inplace_001d19a0;
  pWVar10 = (World *)(puVar5 + 2);
  *(undefined2 *)(puVar5 + 2) = 0;
  *(short *)((long)puVar5 + 0x12) = (short)amount;
  *(int *)((long)puVar5 + 0x14) = num;
  *(uchar *)(puVar5 + 3) = y;
  *(char *)((long)puVar5 + 0x19) = (char)from;
  *(undefined4 *)((long)puVar5 + 0x1c) = 0;
  puVar5[4] = 0;
  *(undefined8 **)&this->id = puVar5;
  this->world = pWVar10;
  if (in_stack_00000008 != (Character *)0x0) {
    p_Var9 = (this_02->items).
             super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var9 == (_List_node_base *)&this_02->items) {
      iVar12 = 0;
      iVar11 = 0;
    }
    else {
      iVar11 = 0;
      iVar12 = 0;
      do {
        p_Var2 = p_Var9[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (*(uchar *)&p_Var2->_M_prev == y) {
          iVar12 = iVar12 + (uint)(*(char *)((long)&p_Var2->_M_prev + 1) == (char)from);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        p_Var9 = p_Var9->_M_next;
        iVar11 = iVar11 + 1;
      } while (p_Var9 != (_List_node_base *)&this_02->items);
    }
    pWVar10 = this_02->world;
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxTile","");
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar10->config,(key_type *)local_80);
    iVar4 = util::variant::GetInt(pmVar6);
    bVar3 = true;
    _Var8._M_pi = extraout_RDX;
    if (iVar12 < iVar4) {
      pWVar10 = this_02->world;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MaxMap","");
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar10->config,&local_50);
      iVar12 = util::variant::GetInt(pmVar6);
      bVar3 = iVar12 <= iVar11;
      _Var8._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        _Var8._M_pi = extraout_RDX_01;
      }
    }
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      _Var8._M_pi = extraout_RDX_02;
    }
    if (bVar3) goto LAB_00175bc1;
    pWVar10 = this->world;
  }
  iVar11 = GenerateItemID(this_02);
  *(short *)&pWVar10->last_character_id = (short)iVar11;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_80,PACKET_ITEM,PACKET_ADD,9);
  PacketBuilder::AddShort((PacketBuilder *)local_80,(int)(short)amount);
  PacketBuilder::AddShort((PacketBuilder *)local_80,(int)(short)pWVar10->last_character_id);
  PacketBuilder::AddThree((PacketBuilder *)local_80,num);
  PacketBuilder::AddChar((PacketBuilder *)local_80,(uint)y);
  PacketBuilder::AddChar((PacketBuilder *)local_80,(uint)from & 0xff);
  p_Var9 = (this_02->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)&this_02->characters) {
    do {
      this_01 = (Character *)p_Var9[1]._M_next;
      if (((in_stack_00000008 == (Character *)0x0) || (this_01 != in_stack_00000008)) &&
         (bVar3 = Character::InRange(this_01,(Map_Item *)pWVar10), bVar3)) {
        Character::Send(this_01,(PacketBuilder *)local_80);
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)&this_02->characters);
  }
  p_Var7 = std::__cxx11::list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>::
           _M_create_node<std::shared_ptr<Map_Item>const&>
                     ((list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>> *)
                      &this_02->items,(shared_ptr<Map_Item> *)this);
  std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
  psVar1 = &(this_02->items).
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_80);
  _Var8._M_pi = extraout_RDX_03;
LAB_00175bc1:
  sVar13.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar13.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Map_Item>)sVar13.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::AddItem(short id, int amount, unsigned char x, unsigned char y, Character *from)
{
	std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(0, id, amount, x, y, 0, 0));

	if (from || (from && from->SourceAccess() <= ADMIN_GM))
	{
		int ontile = 0;
		int onmap = 0;

		UTIL_FOREACH(this->items, item)
		{
			++onmap;
			if (item->x == x && item->y == y)
			{
				++ontile;
			}
		}

		if (ontile >= static_cast<int>(this->world->config["MaxTile"]) || onmap >= static_cast<int>(this->world->config["MaxMap"]))
		{
			return newitem;
		}
	}

	newitem->uid = GenerateItemID();

	PacketBuilder builder(PACKET_ITEM, PACKET_ADD, 9);
	builder.AddShort(id);
	builder.AddShort(newitem->uid);
	builder.AddThree(amount);
	builder.AddChar(x);
	builder.AddChar(y);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(*newitem))
		{
			continue;
		}

		character->Send(builder);
	}

	this->items.push_back(newitem);
	return newitem;
}